

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  char *pcVar1;
  const_pointer pcVar2;
  char cVar3;
  RegexpStatus *pRVar4;
  const_pointer pcVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  size_type sVar10;
  ParseFlags PVar11;
  bool bVar12;
  size_type sVar13;
  StringPiece t;
  Rune c;
  size_type local_1a8 [47];
  
  t.data_ = s->data_;
  t.size_ = s->size_;
  PVar11 = this->flags_;
  if (((((PVar11 >> 9 & 1) == 0) || (t.size_ < 2)) || (*t.data_ != '(')) || (t.data_[1] != '?')) {
    LogMessage::LogMessage
              ((LogMessage *)&c,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
               ,0x7fb);
    std::operator<<((ostream *)local_1a8,"Bad call to ParseState::ParsePerlFlags");
    LogMessage::~LogMessage((LogMessage *)&c);
    this->status_->code_ = kRegexpInternalError;
  }
  else {
    pcVar1 = t.data_ + 2;
    t.size_ = t.size_ - 2;
    if (((t.size_ < 3) || (*pcVar1 != 'P')) || (t.data_[3] != '<')) {
      bVar8 = false;
      bVar6 = 0;
      t.data_ = pcVar1;
      do {
        bVar12 = false;
        bVar7 = bVar8;
        while( true ) {
          while( true ) {
            do {
              bVar8 = bVar7;
              if (bVar12) {
                if ((bool)(~bVar8 | bVar6)) {
                  this->flags_ = PVar11;
                  s->data_ = t.data_;
                  s->size_ = t.size_;
                  return true;
                }
                goto LAB_001b9b03;
              }
              if (t.size_ == 0) goto LAB_001b9b03;
              iVar9 = StringPieceToRune(&c,&t,this->status_);
              if (iVar9 < 0) {
                return false;
              }
              bVar12 = true;
              bVar7 = bVar8;
            } while (c == 0x29);
            if (c != 0x2d) break;
            bVar6 = 0;
            bVar12 = false;
            bVar7 = true;
            if (bVar8) goto LAB_001b9b03;
          }
          if (c != 0x3a) break;
          DoLeftParenNoCapture(this);
        }
        if (c == 0x55) {
          if (bVar8) {
            PVar11 = PVar11 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               Latin1|OneLine|MatchNL|Literal|FoldCase);
          }
          else {
            PVar11 = PVar11 | NonGreedy;
          }
        }
        else if (c == 0x73) {
          if (bVar8) {
            PVar11 = PVar11 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               NonGreedy|Latin1|OneLine|ClassNL|Literal|FoldCase);
          }
          else {
            PVar11 = PVar11 | DotNL;
          }
        }
        else if (c == 0x6d) {
          if (bVar8) {
            PVar11 = PVar11 | OneLine;
          }
          else {
            PVar11 = PVar11 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               NonGreedy|Latin1|MatchNL|Literal|FoldCase);
          }
        }
        else {
          if (c != 0x69) {
LAB_001b9b03:
            pRVar4 = this->status_;
            pRVar4->code_ = kRegexpBadPerlOp;
            pcVar5 = s->data_;
            (pRVar4->error_arg_).data_ = pcVar5;
            (pRVar4->error_arg_).size_ = (long)t.data_ - (long)pcVar5;
            return false;
          }
          if (bVar8) {
            PVar11 = PVar11 & (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|
                               NonGreedy|Latin1|OneLine|MatchNL|Literal);
          }
          else {
            PVar11 = PVar11 | FoldCase;
          }
        }
        bVar6 = 1;
      } while( true );
    }
    sVar13 = 2;
    t.data_ = pcVar1;
    sVar10 = StringPiece::find(&t,'>',2);
    pcVar5 = t.data_;
    if (sVar10 == 0xffffffffffffffff) {
      bVar8 = IsValidUTF8(s,this->status_);
      if (bVar8) {
        pRVar4 = this->status_;
        pRVar4->code_ = kRegexpBadNamedCapture;
        sVar13 = s->size_;
        (pRVar4->error_arg_).data_ = s->data_;
        (pRVar4->error_arg_).size_ = sVar13;
      }
    }
    else {
      _c = t.data_ + 2;
      local_1a8[0] = sVar10 - 2;
      bVar8 = IsValidUTF8((StringPiece *)&c,this->status_);
      if (bVar8) {
        pcVar2 = pcVar5 + -2;
        if (sVar10 - 2 != 0) {
          while( true ) {
            if (sVar10 == sVar13) {
              DoLeftParen(this,(StringPiece *)&c);
              pcVar5 = s->data_;
              s->data_ = pcVar2 + sVar10 + 3;
              s->size_ = (size_type)(pcVar5 + (s->size_ - (long)(pcVar2 + sVar10 + 3)));
              return true;
            }
            cVar3 = pcVar5[sVar13];
            if ((0x19 < (byte)(cVar3 + 0x9fU) && 9 < (byte)(cVar3 - 0x30U)) &&
               (cVar3 != '_' && 0x19 < (byte)(cVar3 + 0xbfU))) break;
            sVar13 = sVar13 + 1;
          }
        }
        pRVar4 = this->status_;
        pRVar4->code_ = kRegexpBadNamedCapture;
        (pRVar4->error_arg_).data_ = pcVar2;
        (pRVar4->error_arg_).size_ = sVar10 + 3;
      }
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    status_->set_code(kRegexpInternalError);
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.data()-2, end+3);  // "(?P<name>"
    StringPiece name(t.data()+2, end-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(
        static_cast<size_t>(capture.data() + capture.size() - s->data()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.size() == 0)
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->data(), static_cast<size_t>(t.data() - s->data())));
  return false;
}